

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O3

bool ot::commissioner::tlv::IsDatasetParameter(bool aIsActiveDataset,Type aTlvType)

{
  set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
  *psVar1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  initializer_list<ot::commissioner::tlv::Type> __l;
  initializer_list<ot::commissioner::tlv::Type> __l_00;
  allocator_type local_2a;
  less<ot::commissioner::tlv::Type> local_29;
  Type local_28 [8];
  undefined4 local_20;
  
  if ((IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kActiveSet == '\0') &&
     (iVar2 = __cxa_guard_acquire(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kActiveSet)
     , iVar2 != 0)) {
    local_28[0] = kActiveTimestamp;
    local_28[1] = kChannel;
    local_28[2] = kChannelMask;
    local_28[3] = kExtendedPanId;
    local_28[4] = kNetworkDiagNetworkData;
    local_28[5] = kNetworkDiagRoute64;
    local_28[6] = kNetworkDiagTimeout;
    local_28[7] = kNetworkDiagMacAddress;
    local_20 = CONCAT22(local_20._2_2_,0xc04);
    __l._M_len = 10;
    __l._M_array = local_28;
    std::
    set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
    ::set(&IsDatasetParameter::kActiveSet,__l,&local_29,&local_2a);
    __cxa_atexit(std::
                 set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
                 ::~set,&IsDatasetParameter::kActiveSet,&__dso_handle);
    __cxa_guard_release(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kActiveSet);
  }
  if ((IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kPendingSet == '\0') &&
     (iVar2 = __cxa_guard_acquire(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kPendingSet
                                 ), iVar2 != 0)) {
    local_28[0] = kActiveTimestamp;
    local_28[1] = kChannel;
    local_28[2] = kChannelMask;
    local_28[3] = kDelayTimer;
    local_28[4] = kExtendedPanId;
    local_28[5] = kNetworkDiagNetworkData;
    local_28[6] = kNetworkDiagRoute64;
    local_28[7] = kNetworkDiagTimeout;
    local_20 = 0xc043301;
    __l_00._M_len = 0xc;
    __l_00._M_array = local_28;
    std::
    set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
    ::set(&IsDatasetParameter::kPendingSet,__l_00,&local_29,&local_2a);
    __cxa_atexit(std::
                 set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
                 ::~set,&IsDatasetParameter::kPendingSet,&__dso_handle);
    __cxa_guard_release(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kPendingSet);
  }
  psVar1 = &IsDatasetParameter::kPendingSet;
  if (aIsActiveDataset) {
    psVar1 = &IsDatasetParameter::kActiveSet;
  }
  p_Var4 = (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = (_Base_ptr)0x27abb0;
  if (aIsActiveDataset) {
    p_Var3 = (_Base_ptr)0x27ab78;
  }
  p_Var5 = p_Var3;
  p_Var6 = p_Var3;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      bVar7 = (Type)p_Var4[1]._M_color < aTlvType;
      if (!bVar7) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar7];
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((p_Var5 != p_Var3) && (p_Var6 = p_Var5, aTlvType < (Type)p_Var5[1]._M_color)) {
      p_Var6 = p_Var3;
    }
  }
  return p_Var6 != p_Var3;
}

Assistant:

bool IsDatasetParameter(bool aIsActiveDataset, tlv::Type aTlvType)
{
    static const std::set<tlv::Type> kActiveSet = {tlv::Type::kActiveTimestamp,
                                                   tlv::Type::kChannel,
                                                   tlv::Type::kChannelMask,
                                                   tlv::Type::kExtendedPanId,
                                                   tlv::Type::kNetworkMeshLocalPrefix,
                                                   tlv::Type::kNetworkMasterKey,
                                                   tlv::Type::kNetworkName,
                                                   tlv::Type::kPanId,
                                                   tlv::Type::kPSKc,
                                                   tlv::Type::kSecurityPolicy};

    static const std::set<tlv::Type> kPendingSet = {
        tlv::Type::kActiveTimestamp,  tlv::Type::kChannel,       tlv::Type::kChannelMask,
        tlv::Type::kDelayTimer,       tlv::Type::kExtendedPanId, tlv::Type::kNetworkMeshLocalPrefix,
        tlv::Type::kNetworkMasterKey, tlv::Type::kNetworkName,   tlv::Type::kPanId,
        tlv::Type::kPendingTimestamp, tlv::Type::kPSKc,          tlv::Type::kSecurityPolicy};

    return (aIsActiveDataset ? kActiveSet : kPendingSet).count(aTlvType) != 0;
}